

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O3

uint32_t __thiscall absl::lts_20250127::base_internal::SpinLock::SpinLoop(SpinLock *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  anon_class_1_0_00000001 *in_RDX;
  SchedulingMode in_ESI;
  
  iVar3 = SpinLoop::adaptive_spin_count;
  if ((__atomic_base<unsigned_int>)
      SpinLoop::init_adaptive_spin_count.control_.super___atomic_base<unsigned_int>._M_i !=
      (__atomic_base<unsigned_int>)0xdd) {
    CallOnceImpl<absl::lts_20250127::base_internal::SpinLock::SpinLoop()::__0>
              (&SpinLoop::init_adaptive_spin_count.control_,in_ESI,in_RDX);
    iVar3 = SpinLoop::adaptive_spin_count;
  }
  do {
    uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if ((uVar1 & 1) == 0) {
      return uVar1;
    }
    bVar2 = 1 < iVar3;
    iVar3 = iVar3 + -1;
  } while (bVar2);
  return uVar1;
}

Assistant:

uint32_t SpinLock::SpinLoop() {
  // We are already in the slow path of SpinLock, initialize the
  // adaptive_spin_count here.
  ABSL_CONST_INIT static absl::once_flag init_adaptive_spin_count;
  ABSL_CONST_INIT static int adaptive_spin_count = 0;
  base_internal::LowLevelCallOnce(&init_adaptive_spin_count, []() {
    adaptive_spin_count = base_internal::NumCPUs() > 1 ? 1000 : 1;
  });

  int c = adaptive_spin_count;
  uint32_t lock_value;
  do {
    lock_value = lockword_.load(std::memory_order_relaxed);
  } while ((lock_value & kSpinLockHeld) != 0 && --c > 0);
  return lock_value;
}